

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O3

bool CaptureSummary::CaptureLineIsSameKey(CaptureLine *x,CaptureLine *y)

{
  char cVar1;
  char cVar2;
  long lVar3;
  bool bVar4;
  
  cVar1 = x->registry_name[0];
  cVar2 = y->registry_name[0];
  if (cVar1 != '\0' && cVar1 == cVar2) {
    lVar3 = 1;
    do {
      cVar1 = x->registry_name[lVar3];
      cVar2 = y->registry_name[lVar3];
      if (cVar1 == '\0') break;
      lVar3 = lVar3 + 1;
    } while (cVar1 == cVar2);
  }
  if ((cVar1 != cVar2) || (x->key_type != y->key_type)) {
    return false;
  }
  if (x->key_type == 0) {
    bVar4 = (x->field_2).key_number == (y->field_2).key_number;
  }
  else {
    cVar1 = (x->field_2).key_value[0];
    cVar2 = (y->field_2).key_value[0];
    if (cVar1 != '\0' && cVar1 == cVar2) {
      lVar3 = 0x45;
      do {
        cVar1 = x->registry_name[lVar3];
        cVar2 = y->registry_name[lVar3];
        if (cVar1 == '\0') break;
        lVar3 = lVar3 + 1;
      } while (cVar1 == cVar2);
    }
    bVar4 = cVar1 == cVar2;
  }
  return bVar4;
}

Assistant:

int CaptureSummary::compare_string(char const * x, char const * y)
{
    int ret = 0;
    uint8_t ux, uy;

    while (*x == *y && *x != 0)
    {
        x++;
        y++;
    }

    ux = (uint8_t)*x;
    uy = (uint8_t)*y;

    if (ux < uy)
    {
        ret = 1;
    }
    else if (ux > uy)
    {
        ret = -1;
    }

    return ret;
}